

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::init
          (TextureCubeMapArrayGenerateMipMapFilterable *this,EVP_PKEY_CTX *ctx)

{
  NotSupportedError *this_00;
  allocator<char> local_31;
  string local_30;
  TextureCubeMapArrayGenerateMipMapFilterable *local_10;
  TextureCubeMapArrayGenerateMipMapFilterable *this_local;
  
  local_10 = this;
  TestCaseBase::init(&this->super_TestCaseBase,ctx);
  if (((this->super_TestCaseBase).m_is_texture_cube_map_array_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Texture cube map array functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return (int)this;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::init()
{
	/* Base class initialization */
	TestCaseBase::init();

	/* Check if texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED);
	}
}